

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
* __thiscall
pstore::json::details::
token_matcher<pstore::exchange::import_ns::callbacks,_pstore::json::details::null_complete>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
           *__return_storage_ptr__,
          token_matcher<pstore::exchange::import_ns::callbacks,_pstore::json::details::null_complete>
          *this,parser<pstore::exchange::import_ns::callbacks> *parser,maybe<char,_void> *ch)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  *puVar5;
  char *pcVar6;
  error_category *peVar7;
  error_category *extraout_RDX;
  bool bVar8;
  error_code err;
  error_code err_00;
  bool bVar9;
  
  iVar2 = (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_;
  if (iVar2 == 2) {
    if (ch->valid_ == true) {
      pcVar6 = maybe<char,_void>::operator->(ch);
      pcVar4 = this->text_;
      if (*pcVar6 == *pcVar4) {
        this->text_ = pcVar4 + 1;
        bVar8 = true;
        if (pcVar4[1] != '\0') goto LAB_0011865f;
        iVar2 = 3;
        bVar9 = true;
        goto LAB_0011865b;
      }
    }
LAB_0011863a:
    peVar7 = get_error_category();
    err_00._M_cat = peVar7;
    err_00._0_8_ = 0xb;
    bVar1 = parser<pstore::exchange::import_ns::callbacks>::set_error(parser,err_00);
    bVar8 = true;
    iVar2 = 1;
    bVar9 = true;
    if (!bVar1) goto LAB_0011865f;
  }
  else {
    bVar9 = true;
    bVar8 = true;
    if (iVar2 != 3) {
      if (iVar2 == 1) {
        assert_failed("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                      ,0x1ad);
      }
      goto LAB_0011865f;
    }
    if (ch->valid_ == true) {
      pcVar4 = maybe<char,_void>::operator->(ch);
      iVar2 = isalnum((int)*pcVar4);
      if (iVar2 != 0) goto LAB_0011863a;
      bVar9 = false;
    }
    puVar5 = exchange::import_ns::callbacks::top(&parser->callbacks_);
    uVar3 = (*((puVar5->_M_t).
               super___uniq_ptr_impl<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
               ._M_t.
               super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
               .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl)->
              _vptr_rule[8])();
    err._4_4_ = 0;
    err._M_value = uVar3;
    err._M_cat = extraout_RDX;
    parser<pstore::exchange::import_ns::callbacks>::set_error(parser,err);
    iVar2 = 1;
  }
LAB_0011865b:
  bVar8 = bVar9;
  (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = iVar2;
LAB_0011865f:
  *(undefined8 *)
   &(__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
       = 1;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
  ._M_head_impl = (matcher<pstore::exchange::import_ns::callbacks> *)0x0;
  __return_storage_ptr__->second = bVar8;
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            token_matcher<Callbacks, DoneFunction>::consume (parser<Callbacks> & parser,
                                                             maybe<char> ch) {
                bool match = true;
                switch (this->get_state ()) {
                case start_state:
                    if (!ch || *ch != *text_) {
                        this->set_error (parser, error_code::unrecognized_token);
                    } else {
                        ++text_;
                        if (*text_ == '\0') {
                            // We've run out of input text, so ensure that the next character isn't
                            // alpha-numeric.
                            this->set_state (last_state);
                        }
                    }
                    break;
                case last_state:
                    if (ch) {
                        if (std::isalnum (*ch) != 0) {
                            this->set_error (parser, error_code::unrecognized_token);
                            return {nullptr, true};
                        }
                        match = false;
                    }
                    this->set_error (parser, done_ (parser));
                    this->set_state (done_state);
                    break;
                case done_state: PSTORE_ASSERT (false); break;
                }
                return {nullptr, match};
            }